

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

void sptk::PrintDataType(string *symbol,ostream *stream)

{
  bool bVar1;
  ostream *poVar2;
  ostream *in_RSI;
  string *in_RDI;
  ostringstream oss;
  size_t data_size;
  string data_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  string local_1f0 [32];
  int local_1d0;
  int local_1cc;
  ostringstream local_1c8 [376];
  ulong local_50;
  allocator local_31;
  string local_30 [32];
  ostream *local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_50 = 0;
  bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  if (bVar1) {
    std::__cxx11::string::operator=(local_30,"char");
    local_50 = 1;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    if (bVar1) {
      std::__cxx11::string::operator=(local_30,"short");
      local_50 = 2;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      if (bVar1) {
        std::__cxx11::string::operator=(local_30,"int");
        local_50 = 3;
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        if (bVar1) {
          std::__cxx11::string::operator=(local_30,"int");
          local_50 = 4;
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
          if (bVar1) {
            std::__cxx11::string::operator=(local_30,"long");
            local_50 = 8;
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
            if (bVar1) {
              std::__cxx11::string::operator=(local_30,"unsigned char");
              local_50 = 1;
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
              if (bVar1) {
                std::__cxx11::string::operator=(local_30,"unsigned short");
                local_50 = 2;
              }
              else {
                bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
                if (bVar1) {
                  std::__cxx11::string::operator=(local_30,"unsigned int");
                  local_50 = 3;
                }
                else {
                  bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
                  if (bVar1) {
                    std::__cxx11::string::operator=(local_30,"unsigned int");
                    local_50 = 4;
                  }
                  else {
                    bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
                    if (bVar1) {
                      std::__cxx11::string::operator=(local_30,"unsigned long");
                      local_50 = 8;
                    }
                    else {
                      bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
                      if (bVar1) {
                        std::__cxx11::string::operator=(local_30,"float");
                        local_50 = 4;
                      }
                      else {
                        bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88)
                        ;
                        if (bVar1) {
                          std::__cxx11::string::operator=(local_30,"double");
                          local_50 = 8;
                        }
                        else {
                          bVar1 = std::operator==(in_stack_fffffffffffffd90,
                                                  in_stack_fffffffffffffd88);
                          if (bVar1) {
                            std::__cxx11::string::operator=(local_30,"long double");
                            local_50 = 0x10;
                          }
                          else {
                            bVar1 = std::operator==(in_stack_fffffffffffffd90,
                                                    in_stack_fffffffffffffd88);
                            if (bVar1) {
                              std::__cxx11::string::operator=(local_30,"ascii");
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_1c8);
  local_1cc = (int)std::setw(2);
  poVar2 = std::operator<<((ostream *)local_1c8,(_Setw)local_1cc);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  std::operator<<(poVar2,local_8);
  if (local_50 == 0) {
    poVar2 = std::operator<<((ostream *)local_1c8,"(");
    poVar2 = std::operator<<(poVar2,local_30);
    std::operator<<(poVar2,")");
  }
  else {
    poVar2 = std::operator<<((ostream *)local_1c8,"(");
    poVar2 = std::operator<<(poVar2,local_30);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_50);
    std::operator<<(poVar2,"byte)");
  }
  local_1d0 = (int)std::setw(0x1b);
  poVar2 = std::operator<<(local_10,(_Setw)local_1d0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  std::__cxx11::ostringstream::str();
  std::operator<<(poVar2,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::ostringstream::~ostringstream(local_1c8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void PrintDataType(const std::string& symbol, std::ostream* stream) {
  std::string data_type("");
  std::size_t data_size(0);

  if ("c" == symbol) {
    data_type = "char";
    data_size = sizeof(std::int8_t);
  } else if ("s" == symbol) {
    data_type = "short";
    data_size = sizeof(std::int16_t);
  } else if ("h" == symbol) {
    data_type = "int";
    data_size = sizeof(int24_t);
  } else if ("i" == symbol) {
    data_type = "int";
    data_size = sizeof(std::int32_t);
  } else if ("l" == symbol) {
    data_type = "long";
    data_size = sizeof(std::int64_t);
  } else if ("C" == symbol) {
    data_type = "unsigned char";
    data_size = sizeof(std::uint8_t);
  } else if ("S" == symbol) {
    data_type = "unsigned short";
    data_size = sizeof(std::uint16_t);
  } else if ("H" == symbol) {
    data_type = "unsigned int";
    data_size = sizeof(uint24_t);
  } else if ("I" == symbol) {
    data_type = "unsigned int";
    data_size = sizeof(std::uint32_t);
  } else if ("L" == symbol) {
    data_type = "unsigned long";
    data_size = sizeof(std::uint64_t);
  } else if ("f" == symbol) {
    data_type = "float";
    data_size = sizeof(float);
  } else if ("d" == symbol) {
    data_type = "double";
    data_size = sizeof(double);
  } else if ("e" == symbol) {
    data_type = "long double";
    data_size = sizeof(long double);
  } else if ("a" == symbol) {
    data_type = "ascii";
  }

  std::ostringstream oss;
  oss << std::setw(2) << std::left << symbol;
  if (0 < data_size) {
    oss << "(" << data_type << ", " << data_size << "byte)";
  } else {
    oss << "(" << data_type << ")";
  }
  *stream << std::setw(27) << std::left << oss.str();
}